

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  pointer pbVar3;
  undefined8 this;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  long *plVar7;
  Reader *pRVar8;
  int iVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  string *s;
  pointer pbVar12;
  bool bVar13;
  bool fix;
  string output_xyz;
  double z;
  double y;
  double x;
  double w;
  double v;
  double u;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  non_option_args;
  double gamma;
  double beta;
  double alpha;
  double c;
  double b;
  double a;
  string input_cif;
  string file;
  SuperCellInfo si;
  stringstream ss;
  ifstream test_stream;
  bool local_7a1;
  long *local_7a0;
  char *local_798;
  long local_790 [2];
  double local_780;
  double local_778;
  double local_770;
  double local_768;
  double local_760;
  double local_758;
  int local_74c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_748;
  double local_728;
  double local_720;
  double local_718;
  double local_710;
  double local_708;
  double local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  long *local_678 [2];
  long local_668 [2];
  long *local_658 [2];
  long local_648 [2];
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  long *local_578;
  long local_570;
  long local_568 [2];
  undefined1 local_558 [24];
  double dStack_540;
  double dStack_538;
  double local_530;
  double local_528;
  double dStack_520;
  double local_518;
  double local_510;
  double dStack_508;
  double local_500;
  allocator local_4f8 [16];
  ostream local_4e8 [112];
  ios_base local_478 [264];
  Reader local_370;
  undefined4 local_2a0 [4];
  streambuf local_290 [504];
  SuperCellInfo local_98;
  
  verbose_flag = 0;
  local_7a1 = false;
  local_7a0 = local_790;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a0,"");
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"");
  iVar9 = 0;
  local_728 = 0.0;
  local_720 = 0.0;
  local_718 = 0.0;
  local_780 = 0.0;
  local_778 = 0.0;
  local_770 = 0.0;
  local_710 = 0.0;
  local_708 = 0.0;
  local_700 = 0.0;
  local_768 = 0.0;
  local_760 = 0.0;
  local_758 = 0.0;
  local_74c = argc;
  do {
    local_2a0[0] = 0;
    iVar4 = getopt_long(argc,argv,"fhvz:d:o:n:t:",main::long_options,local_2a0);
    pcVar2 = local_798;
    pcVar1 = _optarg;
    if (iVar4 < 100) {
      if (iVar4 == -1) {
        iVar4 = 3;
        goto LAB_0011a2e0;
      }
      if ((iVar4 != 0) && (iVar4 != 0x3f)) goto switchD_0011a0a6_caseD_65;
      goto LAB_0011a2dd;
    }
    if (0x73 < iVar4) {
      if (iVar4 == 0x74) {
        std::__cxx11::string::string((string *)&local_5d8,_optarg,local_4f8);
        parseThreeCommaList<double>(&local_5d8,&local_718,&local_720,&local_728);
        uVar10 = local_5d8.field_2._M_allocated_capacity;
        _Var11._M_p = local_5d8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) goto LAB_0011a2d5;
      }
      else {
        if (iVar4 == 0x76) {
          printVersion();
          goto LAB_0011a26c;
        }
        if (iVar4 != 0x7a) goto switchD_0011a0a6_caseD_65;
        std::__cxx11::string::string((string *)&local_598,_optarg,local_4f8);
        parseThreeCommaList<double>(&local_598,&local_758,&local_760,&local_768);
        uVar10 = local_598.field_2._M_allocated_capacity;
        _Var11._M_p = local_598._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != &local_598.field_2) goto LAB_0011a2d5;
      }
      goto LAB_0011a2dd;
    }
    switch(iVar4) {
    case 100:
      std::__cxx11::string::string((string *)&local_5f8,_optarg,local_4f8);
      parseThreeCommaList<double>(&local_5f8,&local_770,&local_778,&local_780);
      uVar10 = local_5f8.field_2._M_allocated_capacity;
      _Var11._M_p = local_5f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
LAB_0011a2d5:
        operator_delete(_Var11._M_p,uVar10 + 1);
      }
      goto LAB_0011a2dd;
    default:
switchD_0011a0a6_caseD_65:
      iVar4 = 1;
      iVar9 = 1;
      break;
    case 0x66:
      local_7a1 = true;
      goto LAB_0011a2dd;
    case 0x68:
      printHelp();
LAB_0011a26c:
      iVar9 = 0;
      iVar4 = 1;
      break;
    case 0x6e:
      std::__cxx11::string::string((string *)&local_5b8,_optarg,local_4f8);
      parseThreeCommaList<double>(&local_5b8,&local_700,&local_708,&local_710);
      uVar10 = local_5b8.field_2._M_allocated_capacity;
      _Var11._M_p = local_5b8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) goto LAB_0011a2d5;
LAB_0011a2dd:
      iVar4 = 0;
      break;
    case 0x6f:
      strlen(_optarg);
      argc = local_74c;
      iVar4 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_7a0,0,pcVar2,(ulong)pcVar1);
    }
LAB_0011a2e0:
    if (iVar4 != 0) {
      if (iVar4 == 3) {
        local_748.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_748.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_748.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        while (lVar5 = (long)_optind, _optind < argc) {
          _optind = _optind + 1;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_748
                     ,argv + lVar5);
        }
        bVar13 = local_748.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish ==
                 local_748.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (bVar13) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error: Need one non-option argument (the input .cif)",
                     0x34);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
          std::ostream::put('X');
          std::ostream::flush();
        }
        bVar13 = !bVar13;
        if (0x20 < (ulong)((long)local_748.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_748.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Error: Only expecting one non-option argument (the input .cif). Instead got:",
                     0x4c);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
          std::ostream::put('X');
          std::ostream::flush();
          pbVar3 = local_748.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar12 = local_748.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar3;
              pbVar12 = pbVar12 + 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\t",1);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(pbVar12->_M_dataplus)._M_p,
                                pbVar12->_M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
          bVar13 = false;
        }
        if ((long)local_748.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_748.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x20) {
          std::__cxx11::string::_M_assign((string *)&local_6f8);
        }
        if (((((local_758 == 0.0) && (!NAN(local_758))) && (local_760 == 0.0)) &&
            ((!NAN(local_760) && (local_768 == 0.0)))) && (!NAN(local_768))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error: Did not get valid zone axis",0x22);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
          std::ostream::put('X');
          std::ostream::flush();
          bVar13 = false;
        }
        if (((local_770 <= 0.0) || (local_778 <= 0.0)) || (local_780 <= 0.0)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error: Did not get valid superstructure dimensions",0x32
                    );
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
          std::ostream::put('X');
          std::ostream::flush();
          bVar13 = false;
        }
        std::ifstream::ifstream(local_2a0,(string *)&local_6f8,_S_in);
        std::__cxx11::stringstream::stringstream((stringstream *)local_4f8);
        std::ostream::operator<<(local_4e8,local_290);
        std::ifstream::close();
        std::__cxx11::stringbuf::str();
        if (local_570 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error: Invalid input .cif file",0x1e);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
          std::ostream::put('X');
          std::ostream::flush();
          bVar13 = false;
        }
        iVar9 = 1;
        if (bVar13) {
          if (local_798 == (char *)0x0) {
            std::__cxx11::string::_M_assign((string *)&local_7a0);
            local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_618,local_7a0,local_798 + (long)local_7a0);
            local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,".cif","");
            bVar13 = endsWith(&local_618,&local_638);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_638._M_dataplus._M_p != &local_638.field_2) {
              operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_618._M_dataplus._M_p != &local_618.field_2) {
              operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar13) {
              local_678[0] = local_668;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_678,local_7a0,local_798 + (long)local_7a0);
              std::__cxx11::string::substr((ulong)local_658,(ulong)local_678);
              plVar7 = (long *)std::__cxx11::string::append((char *)local_658);
              pRVar8 = (Reader *)(plVar7 + 2);
              if ((Reader *)*plVar7 == pRVar8) {
                local_558._16_8_ =
                     (pRVar8->symmetrylist).
                     super__Vector_base<CIF::Symmetry,_std::allocator<CIF::Symmetry>_>._M_impl.
                     super__Vector_impl_data._M_start;
                dStack_540 = (double)plVar7[3];
                local_558._0_8_ = (Reader *)(local_558 + 0x10);
              }
              else {
                local_558._16_8_ =
                     (pRVar8->symmetrylist).
                     super__Vector_base<CIF::Symmetry,_std::allocator<CIF::Symmetry>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_558._0_8_ = (Reader *)*plVar7;
              }
              local_558._8_8_ = plVar7[1];
              *plVar7 = (long)pRVar8;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::string::operator=((string *)&local_7a0,(string *)local_558);
              if ((Reader *)local_558._0_8_ != (Reader *)(local_558 + 0x10)) {
                operator_delete((void *)local_558._0_8_,
                                (ulong)((long)&((SymmetryOperation *)local_558._16_8_)->xf + 1));
              }
              if (local_658[0] != local_648) {
                operator_delete(local_658[0],local_648[0] + 1);
              }
              if (local_678[0] != local_668) {
                operator_delete(local_678[0],local_668[0] + 1);
              }
            }
          }
          local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_698,local_7a0,local_798 + (long)local_7a0);
          local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,".xyz","");
          bVar13 = endsWith(&local_698,&local_6b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
            operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._M_dataplus._M_p != &local_698.field_2) {
            operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
          }
          if (!bVar13) {
            std::__cxx11::string::append((char *)&local_7a0);
          }
          if (verbose_flag != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Verbose flag is set",0x13);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
            std::ostream::put(-0x68);
            plVar7 = (long *)std::ostream::flush();
            std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
            std::ostream::put((char)plVar7);
            std::ostream::flush();
          }
          local_558._0_8_ = (Reader *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<CIF::Reader,std::allocator<CIF::Reader>,std::__cxx11::string&,bool&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_558 + 8),
                     (Reader **)local_558,(allocator<CIF::Reader> *)local_658,&local_6f8,&local_7a1)
          ;
          this = local_558._8_8_;
          uVar10 = local_558._0_8_;
          local_558._0_8_ = (Reader *)0x0;
          local_558._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_558._16_8_ = (pointer)0x3ff0000000000000;
          dStack_540 = 0.0;
          dStack_538 = 0.0;
          local_530 = 0.0;
          local_528 = 100.0;
          dStack_520 = 100.0;
          local_518 = 100.0;
          local_510 = 0.0;
          dStack_508 = 0.0;
          local_500 = 0.0;
          CIF::SuperCellInfo::setUVW((SuperCellInfo *)local_558,local_758,local_760,local_768);
          CIF::SuperCellInfo::setABC((SuperCellInfo *)local_558,local_700,local_708,local_710);
          CIF::SuperCellInfo::setWidths((SuperCellInfo *)local_558,local_770,local_778,local_780);
          CIF::SuperCellInfo::setTilts((SuperCellInfo *)local_558,local_718,local_720,local_728);
          CIF::Reader::Reader(&local_370,(Reader *)uVar10);
          local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_6d8,local_7a0,local_798 + (long)local_7a0);
          local_98.uvw.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[2] = (double)local_558._16_8_;
          local_98.uvw.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[0] = (double)local_558._0_8_;
          local_98.uvw.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[1] = (double)local_558._8_8_;
          local_98.abc.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[2] = local_530;
          local_98.abc.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[0] = dStack_540;
          local_98.abc.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[1] = dStack_538;
          local_98.widths.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[0] = local_528;
          local_98.widths.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[1] = dStack_520;
          local_98.widths.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[2] = local_518;
          local_98.tilts.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[0] = local_510;
          local_98.tilts.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[1] = dStack_508;
          local_98.tilts.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[2] = local_500;
          makeXYZ(&local_370,&local_6d8,&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
            operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
          }
          CIF::Reader::~Reader(&local_370);
          iVar9 = 0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
          }
        }
        if (local_578 != local_568) {
          operator_delete(local_578,local_568[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_4f8);
        std::ios_base::~ios_base(local_478);
        std::ifstream::~ifstream(local_2a0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_748);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
        operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
      }
      if (local_7a0 != local_790) {
        operator_delete(local_7a0,local_790[0] + 1);
      }
      return iVar9;
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    verbose_flag = 0; // set the here to be 100% that it is zero
    bool fix = false;
    int cc;

    std::string output_xyz = "";
    std::string input_cif = "";
    double u, v, w, a, b, c, x, y, z, alpha, beta, gamma;
    u = v = w = a = b = c = x = y = z = alpha = beta  = gamma = 0;

    bool valid = true;

    while (true)
    {
        static struct option long_options[] =
                {
                        {"help",       no_argument,       nullptr,       'h'},
                        {"version",    no_argument,       nullptr,       'v'},
                        {"zone",       required_argument, nullptr,       'z'},
                        {"dimensions", required_argument, nullptr,       'd'},
                        {"output",     optional_argument, nullptr,       'o'},
                        {"normal",     optional_argument, nullptr,       'n'},
                        {"tilt",       optional_argument, nullptr,       't'},
                        {"fix",       no_argument, nullptr,       'f'},
                        {"verbose",    no_argument,       &verbose_flag, 1},
                        {nullptr,      0,                 nullptr,       0}
                };
        // getopt_long stores the option index here.
        int option_index = 0;
        cc = getopt_long (argc, argv, "fhvz:d:o:n:t:", long_options, &option_index);

        // Detect the end of the options.
        if (cc == -1)
            break;

        switch (cc)
        {
            case 0:
                break;
            case 'h':
                printHelp();
                return 0;
            case 'v':
                printVersion();
                return 0;
            case 'o':
                output_xyz = optarg;
                break;
            case 'z':
                try {
                    parseThreeCommaList<double>(optarg, u, v, w);
                } catch (const std::exception& ex) {
                    std::cerr << "Error: Cannot parse zone axis:" << "\n\t" << ex.what() << std::endl;
                    valid = false;
                }
                break;
            case 'n':
                try {
                    parseThreeCommaList<double>(optarg, a, b, c);
                } catch (const std::exception& ex) {
                    std::cerr << "Error: Cannot parse normal vector:" << "\n\t" << ex.what() << std::endl;
                    valid = false;
                }
                break;
            case 't':
                try {
                    parseThreeCommaList<double>(optarg, alpha, beta, gamma);
                } catch (const std::exception& ex) {
                    std::cerr << "Error: Cannot parse tilt angles:" << "\n\t" << ex.what() << std::endl;
                    valid = false;
                }
                break;
            case 'd':
                try {
                    parseThreeCommaList<double>(optarg, x, y, z);
                } catch (const std::exception& ex) {
                    std::cerr << "Error: Cannot parse superstructure dimensions:" << "\n\t" << ex.what() << std::endl;
                    valid = false;
                }
                break;
            case 'f':
                fix = true;
                break;
            case '?':
                // getopt_long already printed an error message.
                break;

            default:
                return 1;
        }
    }

    // do the input file (it's the only non option arg)

    // get the non option args
    std::vector<std::string> non_option_args;
    while (optind < argc)
        non_option_args.emplace_back(argv[optind++]);

    if (non_option_args.size() < 1) {
        std::cerr << "Error: Need one non-option argument (the input .cif)" << std::endl;
        valid = false;
    }


    if (non_option_args.size() > 1) {
        std::cerr << "Error: Only expecting one non-option argument (the input .cif). Instead got:" << std::endl;
        for (std::string& s : non_option_args)
            std::cerr << "\t" << s << std::endl;
        valid = false;
    }

    // this is where the input is actually set
    if (non_option_args.size() == 1)
        input_cif = non_option_args[0];

    if (u == 0 && v == 0 && w == 0)  {
        std::cerr << "Error: Did not get valid zone axis" << std::endl;
        valid = false;
    }

    if (x <= 0 || y <= 0 || z <= 0)  {
        std::cerr << "Error: Did not get valid superstructure dimensions" << std::endl;
        valid = false;
    }

    std::ifstream test_stream(input_cif);

    std::stringstream ss;
    ss << test_stream.rdbuf();
    test_stream.close();
    std::string file = ss.str();

    if (file.empty()) {
        std::cerr << "Error: Invalid input .cif file" << std::endl;
        valid = false;
    }

    if (!valid)
        return 1;
    // we now have everything we need in some form. Need to verify the file/directory now.s

    // output file:
    // if we were not give an output file, use the input file (but change the extension)
    if (output_xyz.empty())
    {
        output_xyz = input_cif;
        if (endsWith(output_xyz, ".cif"))
            output_xyz = removeEnd(output_xyz, 4) + ".xyz";
    }

    // else just go with it, but append xyz if it doesnt have it already.
    if (!endsWith(output_xyz, ".xyz"))
        output_xyz += ".xyz";


    if (verbose_flag) {
        std::cout << "Verbose flag is set" << std::endl << std::endl;
    }

    std::shared_ptr<CIF::Reader> cif;

    try {
        cif = std::make_shared<CIF::Reader>(input_cif, fix);
    } catch (const std::exception& ex) {
        std::cerr << "Error: could not read cif file:\n\t" << ex.what() << std::endl;
        return 1;
    }

    CIF::SuperCellInfo si;
    si.setUVW(u, v, w);
    si.setABC(a, b, c);
    si.setWidths(x, y, z);
    si.setTilts(alpha, beta, gamma);

    try {
        makeXYZ(*cif, output_xyz, si);
    } catch (const std::exception& ex) {
        std::cerr << "Error: could not create superstructure:\n\t" << ex.what() << std::endl;
        return 1;
    }

    return 0;
}